

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],long_long&,long_long&,long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [19],longlong *params_1,longlong *params_2,longlong *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<const_char> *params_00;
  CappedArray<char,_26UL> *params_01;
  CappedArray<char,_26UL> *params_02;
  CappedArray<char,_26UL> *params_03;
  long lVar4;
  CappedArray<char,_26UL> *pCVar5;
  CappedArray<char,_26UL> *__return_storage_ptr__;
  String argValues [4];
  String *pSVar6;
  undefined8 uVar7;
  String local_b8;
  String local_a0;
  String local_88;
  String local_70;
  CappedArray<char,_26UL> local_58;
  
  this->exception = (Exception *)0x0;
  local_58.content._0_8_ = strlen(*params);
  pCVar5 = &local_58;
  local_58.currentSize = (size_t)params;
  concat<kj::ArrayPtr<char_const>>(&local_b8,(_ *)pCVar5,params_00);
  __return_storage_ptr__ = &local_58;
  Stringifier::operator*(__return_storage_ptr__,(Stringifier *)pCVar5,*params_1);
  concat<kj::CappedArray<char,26ul>>(&local_a0,(_ *)__return_storage_ptr__,params_01);
  pCVar5 = &local_58;
  Stringifier::operator*(pCVar5,(Stringifier *)__return_storage_ptr__,*params_2);
  concat<kj::CappedArray<char,26ul>>(&local_88,(_ *)pCVar5,params_02);
  Stringifier::operator*(&local_58,(Stringifier *)pCVar5,*params_3);
  concat<kj::CappedArray<char,26ul>>(&local_70,(_ *)&local_58,params_03);
  pSVar6 = &local_b8;
  uVar7 = 4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_b8.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_b8.content.size_ + lVar4);
      *(undefined8 *)((long)&local_b8.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_b8.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_b8.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,pSVar6,uVar7);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}